

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O1

void BinaryCache::RemoveBytecode(char *path)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  void *pvVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint *puVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  bool bVar16;
  
  uVar10 = NULLC::GetStringHash(path);
  bVar16 = DAT_0022d27c != 0;
  uVar15 = 0;
  if ((bVar16) && (uVar15 = 0, uVar10 != *(uint *)(cache + 8))) {
    puVar12 = (uint *)(cache + 0x30);
    uVar9 = 1;
    do {
      uVar14 = uVar9;
      uVar15 = DAT_0022d27c;
      if (DAT_0022d27c == uVar14) break;
      uVar3 = *puVar12;
      puVar12 = puVar12 + 10;
      uVar9 = uVar14 + 1;
      uVar15 = uVar14;
    } while (uVar10 != uVar3);
    bVar16 = uVar14 < DAT_0022d27c;
  }
  if (uVar15 == DAT_0022d27c) {
    return;
  }
  if (bVar16) {
    uVar13 = (ulong)uVar15;
    (*(code *)NULLC::dealloc)(*(undefined8 *)(cache + uVar13 * 0x28));
    if (uVar15 < DAT_0022d27c) {
      pvVar4 = *(void **)(cache + 0x10 + uVar13 * 0x28);
      if (pvVar4 != (void *)0x0) {
        operator_delete__(pvVar4);
      }
      if (uVar15 < DAT_0022d27c) {
        pvVar4 = *(void **)(cache + 0x18 + uVar13 * 0x28);
        if (pvVar4 != (void *)0x0) {
          operator_delete__(pvVar4);
        }
        lVar8 = cache;
        if (DAT_0022d27c == 0) {
          __assert_fail("count > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x62,
                        "T &FastVector<BinaryCache::CodeDescriptor>::back() [T = BinaryCache::CodeDescriptor, zeroNewMemory = false, skipConstructor = false]"
                       );
        }
        if (uVar15 < DAT_0022d27c) {
          uVar11 = (ulong)(DAT_0022d27c - 1);
          *(undefined8 *)(cache + 0x20 + uVar13 * 0x28) =
               *(undefined8 *)(cache + 0x20 + uVar11 * 0x28);
          puVar1 = (undefined8 *)(lVar8 + uVar11 * 0x28);
          uVar5 = *puVar1;
          uVar6 = puVar1[1];
          puVar1 = (undefined8 *)(lVar8 + 0x10 + uVar11 * 0x28);
          uVar7 = puVar1[1];
          puVar2 = (undefined8 *)(lVar8 + 0x10 + uVar13 * 0x28);
          *puVar2 = *puVar1;
          puVar2[1] = uVar7;
          puVar1 = (undefined8 *)(lVar8 + uVar13 * 0x28);
          *puVar1 = uVar5;
          puVar1[1] = uVar6;
          DAT_0022d27c = DAT_0022d27c - 1;
          return;
        }
      }
    }
  }
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x7f,
                "T &FastVector<BinaryCache::CodeDescriptor>::operator[](unsigned int) [T = BinaryCache::CodeDescriptor, zeroNewMemory = false, skipConstructor = false]"
               );
}

Assistant:

void BinaryCache::RemoveBytecode(const char* path)
{
	unsigned int hash = NULLC::GetStringHash(path);
	unsigned int i = 0;
	for(; i < cache.size(); i++)
	{
		if(hash == cache[i].nameHash)
			break;
	}
	if(i == cache.size())
		return;

	NULLC::dealloc((void*)cache[i].name);
	delete[] cache[i].binary;
	delete[] cache[i].lexemes;

	cache[i] = cache.back();
	cache.pop_back();
}